

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

int use_pick_axe2(obj *obj,schar dx,schar dy,schar dz)

{
  char cVar1;
  monst *mtmp;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  trap *trap;
  obj *poVar5;
  int tmp;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  uint x;
  bool bVar11;
  char buf [256];
  schar local_152;
  schar local_151;
  ulong local_150;
  ulong local_148;
  level *local_140;
  char local_138 [264];
  
  if ((byte)(obj->oclass | 4U) == 6) {
    bVar11 = objects[obj->otyp].oc_subtyp != '\x04';
  }
  else {
    bVar11 = true;
  }
  pcVar7 = "digging";
  if (bVar11) {
    pcVar7 = "chopping";
  }
  local_152 = dy;
  local_151 = dx;
  if (((u._1052_1_ & 1) != 0) && (bVar2 = attack(u.ustuck,dx,dy), bVar2 != '\0')) {
    return 1;
  }
  if ((u._1052_1_ & 2) != 0) {
    pcVar10 = "Turbulence torpedoes your %s attempts.";
    goto LAB_00165c7c;
  }
  if (dz < '\0') {
    if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
       ((youmonst.data)->mlet == '\x05')) {
      pcVar7 = "You don\'t have enough leverage.";
      goto LAB_00165a2c;
    }
    pcVar7 = ceiling((int)u.ux,(int)u.uy);
LAB_00165c72:
    pcVar10 = "You can\'t reach the %s.";
    goto LAB_00165c7c;
  }
  if ((local_151 == '\0' && dz == '\0') && local_152 == '\0') {
    uVar8 = mt_random();
    iVar6 = dbon();
    iVar6 = (int)obj->spe + iVar6 + (uVar8 & 1) + 1;
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    pcVar7 = yname(uwep);
    pline("You hit yourself with %s.",pcVar7);
    sprintf(local_138,"%s own %s",
            *(undefined8 *)((long)&genders[0].his + (ulong)((uint)(flags.female != '\0') * 0x30)),
            obj_descr[objects[obj->otyp].oc_name_idx].oc_name);
    losehp(iVar6,local_138,1);
    iflags.botl = '\x01';
    return 1;
  }
  if (dz == '\0') {
    if ((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) ||
        ((youmonst.data)->mlet == '\x1c')) ||
       ((u.uprops[0x1c].intrinsic != 0 && (uVar8 = mt_random(), uVar8 * -0x33333333 < 0x33333334))))
    {
      confdir(&local_151,&local_152);
    }
    uVar8 = (int)u.uy + (int)local_152;
    if (0x4e < ((int)local_151 + (int)u.ux) - 1U || 0x14 < uVar8) {
      pcVar7 = "Clash!";
      goto LAB_00165a2c;
    }
    x = (int)u.ux + (int)local_151;
    local_150 = (ulong)x;
    local_148 = (ulong)uVar8;
    local_140 = level;
    mtmp = level->monsters[local_150][local_148];
    if (((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) &&
       (bVar2 = attack(mtmp,local_151,local_152), bVar2 != '\0')) {
      return 1;
    }
    uVar3 = dig_typ(obj,(xchar)x,(xchar)uVar8);
    if (uVar3 != 0) {
      did_dig_msg = 0;
      digging.quiet = '\0';
      if ((((x == (int)digging.pos.x) && (uVar8 == (int)digging.pos.y)) &&
          (bVar2 = on_level(&digging.level,&u.uz), bVar2 != '\0')) && (digging.down == '\0')) {
        pcVar10 = "begin";
        if (digging.chew == '\0') {
          pcVar10 = "continue";
        }
        pline("You %s %s.",pcVar10,use_pick_axe2::d_action[uVar3]);
        digging._12_2_ = digging._12_2_ & 0xff;
      }
      else {
        if (((uVar3 == 1) && (flags.autodig != '\0')) && (digging.down == '\0')) {
          if (digging.pos.x == u.ux) {
            if ((digging.pos.y == u.uy) &&
               ((uint)digging.lastdigtime <= moves && moves <= digging.lastdigtime + 2U)) {
              did_dig_msg = 1;
              digging.quiet = '\x01';
            }
          }
        }
        digging.down = '\0';
        digging.chew = '\0';
        digging.warned = '\0';
        digging.pos.y = (xchar)uVar8;
        digging.pos.x = (xchar)x;
        assign_level(&digging.level,&u.uz);
        digging.effort = 0;
        if (digging.quiet == '\0') {
          pline("You start %s.",use_pick_axe2::d_action[uVar3]);
        }
      }
      goto LAB_00165deb;
    }
    trap = t_at(level,x,uVar8);
    if ((trap != (trap *)0x0) && ((trap->field_0x8 & 0x1f) == 0x13)) {
      if ((trap->field_0x8 & 0x20) == 0) {
        seetrap(trap);
        pline("There is a spider web there!");
      }
      pcVar7 = aobjnam(obj,"become");
      pline("Your %s entangled in the web.",pcVar7);
      iVar6 = 2;
      iVar9 = -2;
      do {
        uVar8 = mt_random();
        iVar6 = iVar6 + (uVar8 & 1);
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0);
      nomul(-iVar6,"stuck in a spider web");
      nomovemsg = "You pull free.";
      return 1;
    }
    cVar1 = local_140->locations[local_150][local_148].typ;
    if (cVar1 != '\r') {
      if (cVar1 == '\x16') {
        pline("Clang!");
        wake_nearby();
        return 1;
      }
      if ((cVar1 != '\x0e') && ((cVar1 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) == 0)) {
        if (cVar1 < '\x11') {
          pcVar7 = "You need a pick to dig rock.";
          goto LAB_00165a2c;
        }
        if ((bVar11) &&
           ((poVar5 = sobj_at(0x215,level,x,uVar8), poVar5 != (obj *)0x0 ||
            (poVar5 = sobj_at(0x214,level,x,uVar8), poVar5 != (obj *)0x0)))) {
          uVar4 = mt_random();
          uVar3 = (uVar4 / 3) * 3;
          poVar5 = sobj_at(0x215,level,x,uVar8);
          pcVar7 = "statue";
          if (poVar5 == (obj *)0x0) {
            pcVar7 = "boulder";
          }
          pcVar10 = "";
          if (uVar4 == uVar3) {
            pcVar10 = " The axe-handle vibrates violently!";
          }
          pline("Sparks fly as you whack the %s.%s",pcVar7,pcVar10);
          if (uVar4 != uVar3) {
            return 1;
          }
          losehp(2,"axing a hard object",1);
          return 1;
        }
        goto LAB_001659db;
      }
    }
    pcVar7 = "You need an axe to cut down a tree.";
LAB_00165a2c:
    pline(pcVar7);
    return 1;
  }
  bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
  if ((bVar2 != '\0') || (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
LAB_001659db:
    pcVar7 = aobjnam(obj,(char *)0x0);
    pcVar10 = "You swing your %s through thin air.";
    goto LAB_00165c7c;
  }
  bVar2 = can_reach_floor();
  if (bVar2 == '\0') {
    pcVar7 = surface((int)u.ux,(int)u.uy);
    goto LAB_00165c72;
  }
  bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
  if (bVar2 == '\0') {
    bVar2 = is_lava(level,(int)u.ux,(int)u.uy);
    if (bVar2 == '\0') {
      if (bVar11) {
        pcVar7 = aobjnam(obj,(char *)0x0);
        pcVar10 = surface((int)u.ux,(int)u.uy);
        pline("Your %s merely scratches the %s.",pcVar7,pcVar10);
        u_wipe_engr(3);
        return 1;
      }
      if (digging.pos.x == u.ux) {
        if (((digging.pos.y != u.uy) || (bVar2 = on_level(&digging.level,&u.uz), bVar2 == '\0')) ||
           (digging.down == '\0')) goto LAB_00165fbf;
        pline("You continue %s downward.",pcVar7);
      }
      else {
LAB_00165fbf:
        digging.down = '\x01';
        digging.chew = '\0';
        digging.warned = '\0';
        digging.pos.x = u.ux;
        digging.pos.y = u.uy;
        assign_level(&digging.level,&u.uz);
        digging.effort = 0;
        pline("You start %s downward.",pcVar7);
        if (u.ushops[0] != '\0') {
          shopdig(0);
        }
      }
      did_dig_msg = 0;
LAB_00165deb:
      set_occupation(dig,pcVar7,0);
      return 1;
    }
  }
  bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
  pcVar7 = "water";
  if (bVar2 == '\0') {
    pcVar7 = " the lava";
  }
  pcVar10 = "You cannot stay under%s long enough.";
LAB_00165c7c:
  pline(pcVar10,pcVar7);
  return 1;
}

Assistant:

int use_pick_axe2(struct obj *obj, schar dx, schar dy, schar dz)
{
	int rx, ry;
	struct rm *loc;
	int dig_target;
	boolean ispick = is_pick(obj);
	const char *verbing = ispick ? "digging" : "chopping";

	if (u.uswallow && attack(u.ustuck, dx, dy)) {
		;  /* return 1 */
	} else if (Underwater) {
		pline("Turbulence torpedoes your %s attempts.", verbing);
	} else if (dz < 0) {
		if (Levitation)
			pline("You don't have enough leverage.");
		else
			pline("You can't reach the %s.",ceiling(u.ux,u.uy));
	} else if (!dx && !dy && !dz) {
		char buf[BUFSZ];
		int dam;

		dam = rnd(2) + dbon() + obj->spe;
		if (dam <= 0)
		    dam = 1;
		pline("You hit yourself with %s.", yname(uwep));
		sprintf(buf, "%s own %s", uhis(),
				OBJ_NAME(objects[obj->otyp]));
		losehp(dam, buf, KILLED_BY);
		iflags.botl=1;
		return 1;
	} else if (dz == 0) {
		if (Stunned || (Confusion && !rn2(5)))
		    confdir(&dx, &dy);
		rx = u.ux + dx;
		ry = u.uy + dy;
		if (!isok(rx, ry)) {
			pline("Clash!");
			return 1;
		}
		loc = &level->locations[rx][ry];
		if (MON_AT(level, rx, ry) && attack(m_at(level, rx, ry), dx, dy))
			return 1;
		dig_target = dig_typ(obj, rx, ry);
		if (dig_target == DIGTYP_UNDIGGABLE) {
			/* ACCESSIBLE or POOL */
			struct trap *trap = t_at(level, rx, ry);

			if (trap && trap->ttyp == WEB) {
			    if (!trap->tseen) {
				seetrap(trap);
				pline("There is a spider web there!");
			    }
			    pline("Your %s entangled in the web.",
				aobjnam(obj, "become"));
			    /* you ought to be able to let go; tough luck */
			    /* (maybe `move_into_trap()' would be better) */
			    nomul(-dice(2,2), "stuck in a spider web");
			    nomovemsg = "You pull free.";
			} else if (loc->typ == IRONBARS) {
			    pline("Clang!");
			    wake_nearby();
			} else if (IS_TREES(level, loc->typ))
			    pline("You need an axe to cut down a tree.");
			else if (IS_ROCK(loc->typ))
			    pline("You need a pick to dig rock.");
			else if (!ispick && (sobj_at(STATUE, level, rx, ry) ||
					     sobj_at(BOULDER, level, rx, ry))) {
			    boolean vibrate = !rn2(3);
			    pline("Sparks fly as you whack the %s.%s",
				sobj_at(STATUE, level, rx, ry) ? "statue" : "boulder",
				vibrate ? " The axe-handle vibrates violently!" : "");
			    if (vibrate) losehp(2, "axing a hard object", KILLED_BY);
			}
			else
			    pline("You swing your %s through thin air.",
				aobjnam(obj, NULL));
		} else {
			static const char * const d_action[6] = {
						"swinging",
						"digging",
						"chipping the statue",
						"hitting the boulder",
						"chopping at the door",
						"cutting the tree"
			};
			did_dig_msg = FALSE;
			digging.quiet = FALSE;
			if (digging.pos.x != rx || digging.pos.y != ry ||
			    !on_level(&digging.level, &u.uz) || digging.down) {
			    if (flags.autodig &&
				dig_target == DIGTYP_ROCK && !digging.down &&
				digging.pos.x == u.ux &&
				digging.pos.y == u.uy &&
				(moves <= digging.lastdigtime+2 &&
				 moves >= digging.lastdigtime)) {
				/* avoid messages if repeated autodigging */
				did_dig_msg = TRUE;
				digging.quiet = TRUE;
			    }
			    digging.down = digging.chew = FALSE;
			    digging.warned = FALSE;
			    digging.pos.x = rx;
			    digging.pos.y = ry;
			    assign_level(&digging.level, &u.uz);
			    digging.effort = 0;
			    if (!digging.quiet)
				pline("You start %s.", d_action[dig_target]);
			} else {
			    pline("You %s %s.", digging.chew ? "begin" : "continue",
					d_action[dig_target]);
			    digging.chew = FALSE;
			}
			set_occupation(dig, verbing, 0);
		}
	} else if (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz)) {
		/* it must be air -- water checked above */
		pline("You swing your %s through thin air.", aobjnam(obj, NULL));
	} else if (!can_reach_floor()) {
		pline("You can't reach the %s.", surface(u.ux,u.uy));
	} else if (is_pool(level, u.ux, u.uy) || is_lava(level, u.ux, u.uy)) {
		/* Monsters which swim also happen not to be able to dig */
		pline("You cannot stay under%s long enough.",
				is_pool(level, u.ux, u.uy) ? "water" : " the lava");
	} else if (!ispick) {
		pline("Your %s merely scratches the %s.",
				aobjnam(obj, NULL), surface(u.ux,u.uy));
		u_wipe_engr(3);
	} else {
		if (digging.pos.x != u.ux || digging.pos.y != u.uy ||
			!on_level(&digging.level, &u.uz) || !digging.down) {
		    digging.chew = FALSE;
		    digging.down = TRUE;
		    digging.warned = FALSE;
		    digging.pos.x = u.ux;
		    digging.pos.y = u.uy;
		    assign_level(&digging.level, &u.uz);
		    digging.effort = 0;
		    pline("You start %s downward.", verbing);
		    if (*u.ushops) shopdig(0);
		} else
		    pline("You continue %s downward.", verbing);
		did_dig_msg = FALSE;
		set_occupation(dig, verbing, 0);
	}
	return 1;
}